

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.h
# Opt level: O2

void __thiscall iqxmlrpc::http::Packet::Packet(Packet *this,Packet *param_1)

{
  sp_counted_base *psVar1;
  
  this->_vptr_Packet = (_func_int **)&PTR__Packet_0019cb98;
  (this->header_).px = (param_1->header_).px;
  psVar1 = (param_1->header_).pn.pi_;
  (this->header_).pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  std::__cxx11::string::string((string *)&this->content_,(string *)&param_1->content_);
  return;
}

Assistant:

class LIBIQXMLRPC_API Packet {
protected:
  boost::shared_ptr<http::Header> header_;
  std::string content_;

public:
  Packet( http::Header* header, const std::string& content );
  virtual ~Packet();

  //! Sets header option "connection: {keep-alive|close}".
  //! By default connection is close.
  void set_keep_alive( bool = true );

  const http::Header* header()  const { return header_.get(); }
  const std::string&  content() const { return content_; }

  std::string dump() const
  {
    return header_->dump() + content_;
  }
}